

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pad.cpp
# Opt level: O3

pair<unsigned_long,_unsigned_long> duckdb::PadCountChars(idx_t len,char *data,idx_t size)

{
  long lVar1;
  ulong uVar2;
  ulong uVar3;
  pair<unsigned_long,_unsigned_long> pVar4;
  utf8proc_int32_t codepoint;
  int local_34;
  
  if (size == 0 || len == 0) {
    uVar2 = 0;
    uVar3 = 0;
  }
  else {
    uVar3 = 0;
    uVar2 = 0;
    do {
      lVar1 = duckdb::utf8proc_iterate((uchar *)(data + uVar2),size - uVar2,&local_34);
      uVar2 = lVar1 + uVar2;
      uVar3 = uVar3 + 1;
      if (len <= uVar3) break;
    } while (uVar2 < size);
  }
  pVar4.second = uVar3;
  pVar4.first = uVar2;
  return pVar4;
}

Assistant:

static pair<idx_t, idx_t> PadCountChars(const idx_t len, const char *data, const idx_t size) {
	//  Count how much of str will fit in the output
	auto str = reinterpret_cast<const utf8proc_uint8_t *>(data);
	idx_t nbytes = 0;
	idx_t nchars = 0;
	for (; nchars < len && nbytes < size; ++nchars) {
		utf8proc_int32_t codepoint;
		auto bytes = utf8proc_iterate(str + nbytes, UnsafeNumericCast<utf8proc_ssize_t>(size - nbytes), &codepoint);
		D_ASSERT(bytes > 0);
		nbytes += UnsafeNumericCast<idx_t>(bytes);
	}

	return pair<idx_t, idx_t>(nbytes, nchars);
}